

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_64.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_table_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  int64_t iVar7;
  int64_t iVar8;
  int64_t iVar9;
  int64_t iVar10;
  int64_t iVar11;
  int64_t iVar12;
  int64_t iVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  longlong lVar64;
  longlong lVar65;
  longlong lVar66;
  longlong lVar67;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  long lVar68;
  long extraout_RDX;
  int *array;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  long lVar69;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  ulong extraout_XMM0_Qa_04;
  long lVar70;
  long lVar71;
  long lVar72;
  ulong extraout_XMM0_Qa_05;
  ulong uVar73;
  ulong uVar74;
  ulong extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  ulong extraout_XMM0_Qa_08;
  ulong extraout_XMM0_Qa_09;
  ulong extraout_XMM0_Qa_10;
  ulong extraout_XMM0_Qa_11;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  ulong uVar75;
  ulong extraout_XMM0_Qb_04;
  long lVar76;
  long lVar77;
  long lVar78;
  ulong extraout_XMM0_Qb_05;
  ulong extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  ulong uVar79;
  ulong extraout_XMM0_Qb_08;
  ulong uVar80;
  ulong extraout_XMM0_Qb_09;
  ulong extraout_XMM0_Qb_10;
  ulong extraout_XMM0_Qb_11;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  __m128i vWH_00;
  __m128i vWH_01;
  __m128i vWH_02;
  __m128i vWH_03;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i alVar86;
  __m128i alVar87;
  undefined8 in_stack_ffffffffffffeeb8;
  int local_1104;
  long local_1100;
  int local_10e4;
  long local_10e0;
  int local_10c0;
  int local_10bc;
  ulong *puStack_10b8;
  int32_t k;
  int64_t *j_1;
  int64_t *i_1;
  int64_t *l;
  int64_t *s;
  int64_t *m;
  int64_t *t;
  __m128i cond_Jlt;
  __m128i cond_all;
  __m128i cond_max;
  __m128i cond_eq;
  __m128i cond_valid_IJ;
  __m128i cond_valid_J;
  __m128i cond;
  __m128i vNWL;
  __m128i vNWS;
  __m128i vNWM;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIltLimit;
  int *matrow1;
  int *matrow0;
  __m128i vs2;
  __m128i vs1;
  __m128i vJ;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF_opn;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE_opn;
  __m128i vE;
  __m128i vWL;
  __m128i vWS;
  __m128i vWM;
  __m128i vWH;
  __m128i vNL;
  __m128i vNS;
  __m128i vNM;
  __m128i vNH;
  __m128i case0;
  __m128i case2;
  __m128i case1;
  __m128i vJLimit;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vMaxL;
  __m128i vMaxS;
  __m128i vMaxM;
  __m128i vMaxH;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vN;
  __m128i vOne;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf0;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int64_t *FL_pr;
  int64_t *FS_pr;
  int64_t *FM_pr;
  int64_t *F_pr;
  int64_t *HL_pr;
  int64_t *HS_pr;
  int64_t *HM_pr;
  int64_t *H_pr;
  int64_t *s2;
  int64_t *_FL_pr;
  int64_t *_FS_pr;
  int64_t *_FM_pr;
  int64_t *_F_pr;
  int64_t *_HL_pr;
  int64_t *_HS_pr;
  int64_t *_HM_pr;
  int64_t *_H_pr;
  int64_t *s2B;
  int64_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  ulong uStack_120;
  
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_diag_sse41_128_64","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_diag_sse41_128_64","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_diag_sse41_128_64","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_diag_sse41_128_64","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_diag_sse41_128_64","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
                "parasail_sw_stats_table_diag_sse41_128_64");
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_diag_sse41_128_64","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_diag_sse41_128_64","_s1Len")
        ;
        return (parasail_result_t *)0x0;
      }
    }
    local_10c0 = _s1Len;
    if (matrix->type != 0) {
      local_10c0 = matrix->length;
    }
    NEG_LIMIT._4_4_ = 0;
    NEG_LIMIT._0_4_ = 0;
    if (-open < matrix->min) {
      alVar86[1] = (long)open;
    }
    else {
      alVar86[1] = -(long)matrix->min;
    }
    vNegLimit[1] = alVar86[1] + -0x7fffffffffffffff;
    vJreset[1] = 1;
    vI[0] = 0;
    vMaxH[0] = vNegLimit[1];
    vMaxM[1] = vNegLimit[1];
    vMaxM[0] = vNegLimit[1];
    vMaxS[1] = vNegLimit[1];
    vMaxS[0] = vNegLimit[1];
    vMaxL[1] = vNegLimit[1];
    vMaxL[0] = vNegLimit[1];
    vEndI[1] = vNegLimit[1];
    vEndI[0] = vNegLimit[1];
    vEndJ[1] = vNegLimit[1];
    vEndJ[0] = vNegLimit[1];
    vILimit[1] = vNegLimit[1];
    vILimit[0] = (longlong)local_10c0;
    _s1_local = (char *)parasail_result_new_table3(local_10c0,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x2811004;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int64_t(0x10,(long)(local_10c0 + 1));
      ptr_00 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_01 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_02 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_03 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_04 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_05 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_06 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_07 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      vWH_03[0] = (size_t)(s2Len + 2);
      array = (int *)0x10;
      ptr_08 = parasail_memalign_int64_t(0x10,vWH_03[0]);
      if (ptr == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_02 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_03 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_04 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_05 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_06 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_07 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_08 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        alVar86[1] = extraout_RDX;
        for (end_query = 0; end_query < local_10c0; end_query = end_query + 1) {
          alVar86[1] = (long)matrix->mapper[(byte)_s1[end_query]];
          ptr[end_query] = alVar86[1];
        }
        for (end_query = local_10c0; end_query < local_10c0 + 1; end_query = end_query + 1) {
          ptr[end_query] = 0;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          alVar86[1] = (long)matrix->mapper[(byte)_s2[end_ref]];
          ptr_00[(long)end_ref + 1] = alVar86[1];
        }
        for (end_ref = -1; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 1] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 1) {
          ptr_00[(long)end_ref + 1] = 0;
          iVar1 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 1] = 0;
          ptr_02[(long)end_ref + 1] = 0;
          ptr_03[(long)end_ref + 1] = 0;
          ptr_04[(long)end_ref + 1] = 0;
          ptr_05[(long)end_ref + 1] = vNegLimit[1];
          ptr_06[(long)end_ref + 1] = 0;
          ptr_07[(long)end_ref + 1] = 0;
          ptr_08[(long)end_ref + 1] = 0;
          alVar86[1] = vNegLimit[1];
        }
        for (end_ref = -1; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 1] = vNegLimit[1];
          ptr_02[(long)end_ref + 1] = 0;
          ptr_03[(long)end_ref + 1] = 0;
          ptr_04[(long)end_ref + 1] = 0;
          ptr_05[(long)end_ref + 1] = vNegLimit[1];
          ptr_06[(long)end_ref + 1] = 0;
          ptr_07[(long)end_ref + 1] = 0;
          ptr_08[(long)end_ref + 1] = 0;
          alVar86[1] = vNegLimit[1];
        }
        while (end_ref = iVar1, end_ref < s2Len + 1) {
          ptr_01[(long)end_ref + 1] = vNegLimit[1];
          ptr_02[(long)end_ref + 1] = 0;
          ptr_03[(long)end_ref + 1] = 0;
          ptr_04[(long)end_ref + 1] = 0;
          ptr_05[(long)end_ref + 1] = vNegLimit[1];
          ptr_06[(long)end_ref + 1] = 0;
          ptr_07[(long)end_ref + 1] = 0;
          ptr_08[(long)end_ref + 1] = 0;
          alVar86[1] = vNegLimit[1];
          iVar1 = end_ref + 1;
        }
        *ptr_01 = 0;
        for (end_query = 0; uVar75 = (ulong)(s2Len + 1), end_query < local_10c0;
            end_query = end_query + 2) {
          vNH[0] = 0;
          vNS[1] = 0;
          vNM[0] = 0;
          vNL[1] = 0;
          vNS[0] = 0;
          vWH[1] = 0;
          vNL[0] = 0;
          vWH[0] = 0;
          stack0xfffffffffffff168 = ZEXT816(0);
          stack0xfffffffffffff158 = ZEXT816(0);
          stack0xfffffffffffff148 = ZEXT816(0);
          stack0xfffffffffffff108 = ZEXT816(0);
          stack0xfffffffffffff0f8 = ZEXT816(0);
          stack0xfffffffffffff0e8 = ZEXT816(0);
          stack0xfffffffffffff0a8 = ZEXT816(0);
          stack0xfffffffffffff098 = ZEXT816(0);
          vFL[0] = 0;
          vs1[1] = -1;
          vJ[0] = 0;
          lVar3 = ptr[end_query];
          lVar4 = ptr[(long)end_query + 1];
          piVar5 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_10e0 = ptr[end_query];
          }
          else {
            if (end_query < local_10c0) {
              local_10e4 = end_query;
            }
            else {
              local_10e4 = local_10c0 + -1;
            }
            local_10e0 = (long)local_10e4;
          }
          piVar6 = matrix->matrix;
          if (matrix->type == 0) {
            local_1100 = ptr[end_query + 1];
          }
          else {
            if (end_query + 1 < local_10c0) {
              local_1104 = end_query + 1;
            }
            else {
              local_1104 = local_10c0 + -1;
            }
            local_1100 = (long)local_1104;
          }
          lVar68 = matrix->size * local_1100;
          b[1] = lVar68 * 4;
          alVar87[1] = vWH_03[0];
          alVar87[0] = (longlong)array;
          b[0] = local_1100;
          alVar86 = _mm_cmplt_epi64_rpl(alVar87,b);
          vs2[0] = vNegLimit[1];
          vNM[1] = vNegLimit[1];
          for (end_ref = 0; lVar67 = vNM[1], lVar66 = vNS[1], lVar65 = vNL[1], lVar64 = vWH[1],
              end_ref < s2Len + 1; end_ref = end_ref + 1) {
            vNM[1] = vWH[0];
            iVar7 = ptr_01[(long)end_ref + 1];
            vNS[1] = vWM[0];
            iVar8 = ptr_02[(long)end_ref + 1];
            vNL[1] = vWS[0];
            iVar9 = ptr_03[(long)end_ref + 1];
            vWH[1] = vWL[0];
            iVar10 = ptr_04[(long)end_ref + 1];
            iVar11 = ptr_06[(long)end_ref + 1];
            iVar12 = ptr_07[(long)end_ref + 1];
            b_00[1] = (long)end_ref;
            iVar13 = ptr_08[b_00[1] + 1];
            a[1] = vWH_03[0];
            a[0] = (longlong)array;
            b_00[0] = alVar86[1];
            alVar86 = _mm_max_epi64_rpl(a,b_00);
            b_01[0] = alVar86[1];
            a_00[1] = vWH_03[0];
            a_00[0] = (longlong)array;
            b_01[1] = b_00[1];
            alVar86 = _mm_cmpgt_epi64_rpl(a_00,b_01);
            b_02[0] = alVar86[1];
            auVar62._8_8_ = iVar11;
            auVar62._0_8_ = vFM[0];
            auVar61._8_8_ = iVar8;
            auVar61._0_8_ = vWM[0];
            auVar60._8_8_ = extraout_XMM0_Qb_01;
            auVar60._0_8_ = extraout_XMM0_Qa_01;
            register0x00001240 = pblendvb(auVar62,auVar61,auVar60);
            auVar59._8_8_ = iVar12;
            auVar59._0_8_ = vFS[0];
            auVar58._8_8_ = iVar9;
            auVar58._0_8_ = vWS[0];
            auVar57._8_8_ = extraout_XMM0_Qb_01;
            auVar57._0_8_ = extraout_XMM0_Qa_01;
            register0x00001240 = pblendvb(auVar59,auVar58,auVar57);
            auVar56._8_8_ = iVar13;
            auVar56._0_8_ = vFL[0];
            auVar55._8_8_ = iVar10;
            auVar55._0_8_ = vWL[0];
            auVar54._8_8_ = extraout_XMM0_Qb_01;
            auVar54._0_8_ = extraout_XMM0_Qa_01;
            auVar81 = pblendvb(auVar56,auVar55,auVar54);
            vJ[1] = auVar81._0_8_;
            vFL[0] = auVar81._8_8_;
            lVar69 = vJ[1] + 1;
            vFL[0] = vFL[0] + 1;
            a_01[1] = vWH_03[0];
            a_01[0] = (longlong)array;
            b_02[1] = b_00[1];
            alVar86 = _mm_max_epi64_rpl(a_01,b_02);
            b_03[0] = alVar86[1];
            a_02[1] = vWH_03[0];
            a_02[0] = (longlong)array;
            b_03[1] = b_00[1];
            _mm_cmpgt_epi64_rpl(a_02,b_03);
            auVar53._8_8_ = extraout_XMM0_Qb_03;
            auVar53._0_8_ = extraout_XMM0_Qa_03;
            auVar81 = pblendvb(stack0xfffffffffffff108,stack0xfffffffffffff168,auVar53);
            auVar52._8_8_ = extraout_XMM0_Qb_03;
            auVar52._0_8_ = extraout_XMM0_Qa_03;
            auVar82 = pblendvb(stack0xfffffffffffff0f8,stack0xfffffffffffff158,auVar52);
            auVar51._8_8_ = extraout_XMM0_Qb_03;
            auVar51._0_8_ = extraout_XMM0_Qa_03;
            auVar83 = pblendvb(stack0xfffffffffffff0e8,stack0xfffffffffffff148,auVar51);
            vF[1] = auVar83._0_8_;
            vEL[0] = auVar83._8_8_;
            b_00[1] = ptr_00[(long)end_ref + 1];
            b_04[1] = (long)piVar5[iVar1 * local_10e0 + ptr_00[(long)end_ref + 1]];
            a_03[1] = (long)(end_ref + -1);
            iVar2 = piVar6[lVar68 + ptr_00[a_03[1] + 1]];
            uVar75 = vNH[0] + b_04[1];
            a_03[0] = (longlong)array;
            b_04[0] = ptr_00[a_03[1] + 1];
            alVar86 = _mm_max_epi64_rpl(a_03,b_04);
            b_05[0] = alVar86[1];
            a_04[1] = a_03[1];
            a_04[0] = (longlong)array;
            b_05[1] = b_04[1];
            alVar86 = _mm_max_epi64_rpl(a_04,b_05);
            b_06[0] = alVar86[1];
            a_05[1] = a_03[1];
            a_05[0] = (longlong)array;
            b_06[1] = b_04[1];
            alVar86 = _mm_max_epi64_rpl(a_05,b_06);
            b_07[0] = alVar86[1];
            lVar70 = -(ulong)(extraout_XMM0_Qa_04 == lVar67 + iVar2);
            lVar76 = -(ulong)(extraout_XMM0_Qb_04 == uVar75);
            lVar71 = -(ulong)(extraout_XMM0_Qa_04 == extraout_XMM0_Qa_00);
            lVar77 = -(ulong)(extraout_XMM0_Qb_04 == extraout_XMM0_Qb_00);
            lVar72 = -(ulong)(extraout_XMM0_Qa_04 == 0);
            lVar78 = -(ulong)(extraout_XMM0_Qb_04 == 0);
            vES[1] = auVar81._0_8_;
            vEM[0] = auVar81._8_8_;
            auVar50._8_8_ = lVar77;
            auVar50._0_8_ = lVar71;
            auVar83 = pblendvb(auVar81,register0x00001240,auVar50);
            alVar86[1] = -(ulong)(lVar3 == b_00[1]);
            auVar81._8_4_ = (int)alVar86[1];
            auVar81._0_8_ = -(ulong)(lVar4 == vs2[0]);
            auVar81._12_4_ = (int)((ulong)alVar86[1] >> 0x20);
            uStack_120 = auVar81._8_8_;
            auVar49._8_8_ = vNM[0] + (uStack_120 & 1);
            auVar49._0_8_ = lVar66 + (-(ulong)(lVar4 == vs2[0]) & 1);
            auVar48._8_8_ = lVar76;
            auVar48._0_8_ = lVar70;
            auVar81 = pblendvb(auVar83,auVar49,auVar48);
            auVar47._8_8_ = lVar78;
            auVar47._0_8_ = lVar72;
            auVar81 = pblendvb(auVar81,ZEXT816(0),auVar47);
            vEL[1] = auVar82._0_8_;
            vES[0] = auVar82._8_8_;
            auVar46._8_8_ = lVar77;
            auVar46._0_8_ = lVar71;
            auVar82 = pblendvb(auVar82,register0x00001240,auVar46);
            a_06[1] = a_03[1];
            a_06[0] = (longlong)array;
            b_07[1] = b_04[1];
            alVar86 = _mm_cmpgt_epi64_rpl(a_06,b_07);
            b_08[0] = alVar86[1];
            auVar45._8_8_ = vNS[0] + (extraout_XMM0_Qb_05 & 1);
            auVar45._0_8_ = lVar65 + (extraout_XMM0_Qa_05 & 1);
            auVar44._8_8_ = lVar76;
            auVar44._0_8_ = lVar70;
            auVar82 = pblendvb(auVar82,auVar45,auVar44);
            auVar43._8_8_ = lVar78;
            auVar43._0_8_ = lVar72;
            auVar82 = pblendvb(auVar82,ZEXT816(0),auVar43);
            auVar42._8_8_ = vEL[0] + 1U;
            auVar42._0_8_ = vF[1] + 1U;
            auVar41._8_8_ = vFL[0];
            auVar41._0_8_ = lVar69;
            auVar40._8_8_ = lVar77;
            auVar40._0_8_ = lVar71;
            auVar83 = pblendvb(auVar42,auVar41,auVar40);
            auVar39._8_8_ = vNL[0] + 1;
            auVar39._0_8_ = lVar64 + 1;
            auVar38._8_8_ = lVar76;
            auVar38._0_8_ = lVar70;
            auVar83 = pblendvb(auVar83,auVar39,auVar38);
            auVar85._8_8_ = lVar78;
            auVar85._0_8_ = lVar72;
            auVar83 = pblendvb(auVar83,ZEXT816(0),auVar85);
            uVar73 = -(ulong)(vs1[1] == -1);
            uVar75 = -(ulong)(vJ[0] == -1);
            uVar74 = ~uVar73 & extraout_XMM0_Qa_04;
            vWH[0] = ~uVar75 & extraout_XMM0_Qb_04;
            vWS[1] = auVar81._0_8_;
            vWM[0] = auVar81._8_8_;
            vWS[1] = ~uVar73 & vWS[1];
            vWM[0] = ~uVar75 & vWM[0];
            vWL[1] = auVar82._0_8_;
            vWS[0] = auVar82._8_8_;
            vWL[1] = ~uVar73 & vWL[1];
            vWS[0] = ~uVar75 & vWS[0];
            vE[1] = auVar83._0_8_;
            vWL[0] = auVar83._8_8_;
            vE[1] = ~uVar73 & vE[1];
            vWL[0] = ~uVar75 & vWL[0];
            auVar84._8_8_ = extraout_XMM0_Qb_02;
            auVar84._0_8_ = extraout_XMM0_Qa_02;
            auVar83._8_8_ = vNegLimit[1];
            auVar83._0_8_ = vNegLimit[1];
            auVar82._8_8_ = uVar75;
            auVar82._0_8_ = uVar73;
            pblendvb(auVar84,auVar83,auVar82);
            vEM[0] = ~uVar75 & vEM[0];
            vES[1] = ~uVar73 & vES[1];
            vES[0] = ~uVar75 & vES[0];
            vEL[1] = ~uVar73 & vEL[1];
            uVar75 = (uVar75 ^ 0xffffffffffffffff) & vEL[0] + 1U;
            vEL[0]._0_4_ = (int)uVar75;
            vF[1] = (uVar73 ^ 0xffffffffffffffff) & vF[1] + 1U;
            vEL[0]._4_4_ = (int)(uVar75 >> 0x20);
            if (1 < end_ref) {
              a_07[1] = a_03[1];
              a_07[0] = (longlong)array;
              b_08[1] = b_04[1];
              alVar86 = _mm_min_epi64_rpl(a_07,b_08);
              b_09[0] = alVar86[1];
              a_08[1] = a_03[1];
              a_08[0] = (longlong)array;
              b_09[1] = b_04[1];
              alVar86 = _mm_max_epi64_rpl(a_08,b_09);
              b_10[0] = alVar86[1];
              a_09[1] = a_03[1];
              a_09[0] = (longlong)array;
              b_10[1] = b_04[1];
              alVar86 = _mm_max_epi64_rpl(a_09,b_10);
              b_11[0] = alVar86[1];
              a_10[1] = a_03[1];
              a_10[0] = (longlong)array;
              b_11[1] = b_04[1];
              alVar86 = _mm_max_epi64_rpl(a_10,b_11);
              b_12[0] = alVar86[1];
              a_11[1] = a_03[1];
              a_11[0] = (longlong)array;
              b_12[1] = b_04[1];
              _mm_max_epi64_rpl(a_11,b_12);
            }
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_10c0;
            vWH_00[1]._4_4_ = 0;
            arr_store_si128(*((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table,
                            vWH_00,end_ref,s2Len,gap,(int32_t)in_stack_ffffffffffffeeb8);
            vWH_01[0] = (ulong)(uint)end_query;
            vWH_01[1]._0_4_ = local_10c0;
            vWH_01[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                            trace_del_table + 8),vWH_01,end_ref,s2Len,gap,
                            (int32_t)in_stack_ffffffffffffeeb8);
            vWH_02[0] = (ulong)(uint)end_query;
            vWH_02[1]._0_4_ = local_10c0;
            vWH_02[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                            trace_del_table + 0x10),vWH_02,end_ref,s2Len,gap,
                            (int32_t)in_stack_ffffffffffffeeb8);
            array = *(int **)((long)((((parasail_result_t *)_s1_local)->field_4).trace)->
                                    trace_del_table + 0x18);
            vWH_03[0] = (size_t)(uint)end_query;
            vWH_03[1]._0_4_ = local_10c0;
            vWH_03[1]._4_4_ = 0;
            arr_store_si128(array,vWH_03,end_ref,s2Len,gap,(int32_t)in_stack_ffffffffffffeeb8);
            ptr_01[(long)(end_ref + -1) + 1] = uVar74;
            ptr_02[(long)(end_ref + -1) + 1] = vWS[1];
            ptr_03[(long)(end_ref + -1) + 1] = vWL[1];
            ptr_04[(long)(end_ref + -1) + 1] = vE[1];
            ptr_05[(long)(end_ref + -1) + 1] = extraout_XMM0_Qa_00;
            ptr_06[(long)(end_ref + -1) + 1] = vFS[1];
            ptr_07[(long)(end_ref + -1) + 1] = vFL[1];
            alVar86[1] = (long)(end_ref + -1);
            ptr_08[alVar86[1] + 1] = lVar69;
            a_12[1] = vWH_03[0];
            a_12[0] = (longlong)array;
            alVar86[0] = lVar69;
            alVar87 = _mm_cmpgt_epi64_rpl(a_12,alVar86);
            b_13[0] = alVar87[1];
            a_13[1] = vWH_03[0];
            a_13[0] = (longlong)array;
            b_13[1] = alVar86[1];
            alVar87 = _mm_cmplt_epi64_rpl(a_13,b_13);
            b_14[0] = alVar87[1];
            uVar73 = extraout_XMM0_Qa_06 & extraout_XMM0_Qa_07 & extraout_XMM0_Qa;
            uVar79 = extraout_XMM0_Qb_06 & extraout_XMM0_Qb_07 & extraout_XMM0_Qb;
            bVar14 = uVar74 == vMaxM[1];
            bVar15 = vWH[0] == vMaxH[0];
            a_14[1] = vWH_03[0];
            a_14[0] = (longlong)array;
            b_14[1] = alVar86[1];
            alVar87 = _mm_cmpgt_epi64_rpl(a_14,b_14);
            b_15[0] = alVar87[1];
            uVar75 = extraout_XMM0_Qa_08 & uVar73;
            uVar80 = extraout_XMM0_Qb_08 & uVar79;
            a_15[1] = vWH_03[0];
            a_15[0] = (longlong)array;
            b_15[1] = alVar86[1];
            alVar86 = _mm_cmplt_epi64_rpl(a_15,b_15);
            auVar37._8_8_ = vWH[0];
            auVar37._0_8_ = uVar74;
            auVar36._8_8_ = uVar80;
            auVar36._0_8_ = uVar75;
            register0x00001240 = pblendvb(stack0xfffffffffffff268,auVar37,auVar36);
            auVar35._8_8_ = vWM[0];
            auVar35._0_8_ = vWS[1];
            auVar34._8_8_ = uVar80;
            auVar34._0_8_ = uVar75;
            auVar81 = pblendvb(stack0xfffffffffffff258,auVar35,auVar34);
            auVar33._8_8_ = vWS[0];
            auVar33._0_8_ = vWL[1];
            auVar32._8_8_ = uVar80;
            auVar32._0_8_ = uVar75;
            auVar82 = pblendvb(stack0xfffffffffffff248,auVar33,auVar32);
            auVar31._8_8_ = vWL[0];
            auVar31._0_8_ = vE[1];
            auVar30._8_8_ = uVar80;
            auVar30._0_8_ = uVar75;
            auVar83 = pblendvb(stack0xfffffffffffff238,auVar31,auVar30);
            auVar29._8_8_ = vI[0];
            auVar29._0_8_ = vJreset[1];
            auVar28._8_8_ = uVar80;
            auVar28._0_8_ = uVar75;
            auVar84 = pblendvb(stack0xfffffffffffff228,auVar29,auVar28);
            auVar27._8_8_ = vJ[0];
            auVar27._0_8_ = vs1[1];
            auVar26._8_8_ = uVar80;
            auVar26._0_8_ = uVar75;
            auVar85 = pblendvb(stack0xfffffffffffff218,auVar27,auVar26);
            uVar73 = extraout_XMM0_Qa_09 & -(ulong)bVar14 & uVar73;
            uVar79 = extraout_XMM0_Qb_09 & -(ulong)bVar15 & uVar79;
            auVar25._8_8_ = vWM[0];
            auVar25._0_8_ = vWS[1];
            auVar24._8_8_ = uVar79;
            auVar24._0_8_ = uVar73;
            register0x00001240 = pblendvb(auVar81,auVar25,auVar24);
            auVar23._8_8_ = vWS[0];
            auVar23._0_8_ = vWL[1];
            auVar22._8_8_ = uVar79;
            auVar22._0_8_ = uVar73;
            register0x00001240 = pblendvb(auVar82,auVar23,auVar22);
            auVar21._8_8_ = vWL[0];
            auVar21._0_8_ = vE[1];
            auVar20._8_8_ = uVar79;
            auVar20._0_8_ = uVar73;
            register0x00001240 = pblendvb(auVar83,auVar21,auVar20);
            auVar19._8_8_ = vI[0];
            auVar19._0_8_ = vJreset[1];
            auVar18._8_8_ = uVar79;
            auVar18._0_8_ = uVar73;
            register0x00001240 = pblendvb(auVar84,auVar19,auVar18);
            auVar17._8_8_ = vJ[0];
            auVar17._0_8_ = vs1[1];
            auVar16._8_8_ = uVar79;
            auVar16._0_8_ = uVar73;
            register0x00001240 = pblendvb(auVar85,auVar17,auVar16);
            vs1[1] = vs1[1] + 1;
            vJ[0] = vJ[0] + 1;
            vs2[0] = b_00[1];
            vNL[0] = iVar10;
            vNS[0] = iVar9;
            vNM[0] = iVar8;
            vNH[0] = iVar7;
          }
          vJreset[1] = vJreset[1] + 2;
          vI[0] = vI[0] + 2;
        }
        m = vMaxM;
        s = vMaxS;
        l = vMaxL;
        i_1 = vEndI;
        j_1 = vEndJ;
        puStack_10b8 = (ulong *)vILimit;
        local_10bc = 0;
        length = vNegLimit[1];
        similar = vNegLimit[1];
        matches = vNegLimit[1];
        while( true ) {
          m = m + 1;
          s = s + 1;
          l = l + 1;
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          puStack_10b8 = puStack_10b8 + 1;
          if (1 < local_10bc) break;
          if (matches < *m) {
            matches = *m;
            similar = *s;
            length = *l;
            vNegLimit[1] = *i_1;
            NEG_LIMIT._4_4_ = (int)*j_1;
            NEG_LIMIT._0_4_ = (int)*puStack_10b8;
          }
          else if (*m == matches) {
            uVar75 = (ulong)(int)NEG_LIMIT;
            if ((long)*puStack_10b8 < (long)uVar75) {
              similar = *s;
              length = *l;
              vNegLimit[1] = *i_1;
              NEG_LIMIT._4_4_ = (int)*j_1;
              NEG_LIMIT._0_4_ = (int)*puStack_10b8;
            }
            else {
              uVar75 = (ulong)(int)NEG_LIMIT;
              if ((*puStack_10b8 == uVar75) &&
                 (uVar75 = (ulong)NEG_LIMIT._4_4_, *j_1 < (long)uVar75)) {
                similar = *s;
                length = *l;
                vNegLimit[1] = *i_1;
                NEG_LIMIT._4_4_ = (int)*j_1;
                NEG_LIMIT._0_4_ = (int)*puStack_10b8;
              }
            }
          }
          local_10bc = local_10bc + 1;
        }
        a_16[1] = vWH_03[0];
        a_16[0] = (longlong)array;
        b_16[1] = uVar75;
        b_16[0] = alVar86[1];
        alVar86 = _mm_cmplt_epi64_rpl(a_16,b_16);
        b_17[0] = alVar86[1];
        a_17[1] = vWH_03[0];
        a_17[0] = (longlong)array;
        b_17[1] = uVar75;
        uVar75 = extraout_XMM0_Qa_10;
        _mm_cmpgt_epi64_rpl(a_17,b_17);
        uVar73 = extraout_XMM0_Qb_10 | extraout_XMM0_Qb_11;
        auVar63._8_8_ = uVar73;
        auVar63._0_8_ = uVar75 | extraout_XMM0_Qa_11;
        if ((((((((((((((((auVar63 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar63 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar63 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar63 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar63 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar73 >> 7 & 1) != 0) || (uVar73 >> 0xf & 1) != 0) || (uVar73 >> 0x17 & 1) != 0)
               || (uVar73 >> 0x1f & 1) != 0) || (uVar73 >> 0x27 & 1) != 0) ||
             (uVar73 >> 0x2f & 1) != 0) || (uVar73 >> 0x37 & 1) != 0) || (long)uVar73 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          matches = 0;
          similar._0_4_ = 0;
          length._0_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          NEG_LIMIT._4_4_ = 0;
          NEG_LIMIT._0_4_ = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)matches;
        ((parasail_result_t *)_s1_local)->end_query = NEG_LIMIT._4_4_;
        ((parasail_result_t *)_s1_local)->end_ref = (int)NEG_LIMIT;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->matches = (int)similar;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->similar = (int)length;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->length = (int)vNegLimit[1];
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i case0 = vZero;
        __m128i vNH = vNegInf0;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf0;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            case0 = _mm_cmpeq_epi64(vWH, vZero);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm_blendv_epi8(vWM, vZero, case0);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(vWS, vZero, case0);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            vWL = _mm_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *m = (int64_t*)&vMaxM;
        int64_t *s = (int64_t*)&vMaxS;
        int64_t *l = (int64_t*)&vMaxL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}